

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMatrix.cpp
# Opt level: O2

void testMatrix33ArrayConstructor(float (*a) [3])

{
  bool bVar1;
  Matrix33<float> local_58;
  M33f m;
  
  Imath_3_2::Matrix33<float>::Matrix33(&m,a);
  local_58.x[0][0] = 1.0;
  local_58.x[0][1] = 0.0;
  local_58.x[0][2] = 0.0;
  local_58.x[1][0] = 0.0;
  local_58.x[1][1] = 1.0;
  local_58.x[1][2] = 0.0;
  local_58.x[2][0] = 0.0;
  local_58.x[2][1] = 0.0;
  local_58.x[2][2] = 1.0;
  bVar1 = Imath_3_2::Matrix33<float>::operator==(&m,&local_58);
  if (bVar1) {
    return;
  }
  __assert_fail("m == IMATH_INTERNAL_NAMESPACE::M33f()",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testMatrix.cpp"
                ,0x30,"void testMatrix33ArrayConstructor(const float (*)[3])");
}

Assistant:

void
testMatrix33ArrayConstructor(const float a[3][3])
{
    IMATH_INTERNAL_NAMESPACE::M33f m(a);
    assert(m == IMATH_INTERNAL_NAMESPACE::M33f());
}